

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

bool doctest::detail::checkIfShouldThrow(Enum assert_type)

{
  int iVar1;
  ContextState **ppCVar2;
  bool local_9;
  Enum assert_type_local;
  
  if ((assert_type & DT_REQUIRE) == 0) {
    if (((assert_type & DT_CHECK) != 0) &&
       (ppCVar2 = getContextState(), 0 < (*ppCVar2)->abort_after)) {
      ppCVar2 = getContextState();
      iVar1 = (*ppCVar2)->numFailedAssertions;
      ppCVar2 = getContextState();
      if ((*ppCVar2)->abort_after <= iVar1) {
        return true;
      }
    }
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool checkIfShouldThrow(assertType::Enum assert_type) {
        if(assert_type & assertType::is_require)
            return true;

        if((assert_type & assertType::is_check) && getContextState()->abort_after > 0) {
            if(getContextState()->numFailedAssertions >= getContextState()->abort_after)
                return true;
        }

        return false;
    }